

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void Cmd_dump3df(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  sector_t *psVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  xfloor *this;
  F3DFloor **ppFVar9;
  char *pcVar10;
  double dVar11;
  double dVar12;
  double bheight;
  double height;
  uint i;
  TArray<F3DFloor_*,_F3DFloor_*> *ffloors;
  sector_t *sector;
  int sec;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar5 = FCommandLine::argc(argv);
  if (1 < iVar5) {
    pcVar7 = FCommandLine::operator[](argv,1);
    lVar8 = strtol(pcVar7,(char **)0x0,10);
    psVar4 = sectors;
    iVar5 = (int)lVar8;
    this = &(sectors[iVar5].e)->XFloor;
    for (height._4_4_ = 0;
        uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size((TArray<F3DFloor_*,_F3DFloor_*> *)this),
        height._4_4_ < uVar6; height._4_4_ = height._4_4_ + 1) {
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      dVar11 = secplane_t::ZatPoint(((*ppFVar9)->top).plane,&psVar4[iVar5].centerspot);
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      dVar12 = secplane_t::ZatPoint(((*ppFVar9)->bottom).plane,&psVar4[iVar5].centerspot);
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      uVar6 = (((*ppFVar9)->top).model)->sectornum;
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      uVar1 = (((*ppFVar9)->bottom).model)->sectornum;
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      uVar2 = (*ppFVar9)->flags;
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      uVar3 = (*ppFVar9)->alpha;
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      pcVar7 = "";
      if (((*ppFVar9)->flags & 1) != 0) {
        pcVar7 = "Exists";
      }
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)this,(ulong)height._4_4_);
      pcVar10 = "";
      if (((*ppFVar9)->flags & 0x800000) != 0) {
        pcVar10 = "Dynamic";
      }
      Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n"
             ,dVar11,dVar12,(ulong)height._4_4_,(ulong)uVar6,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
             pcVar7,pcVar10);
    }
  }
  return;
}

Assistant:

CCMD (dump3df)
{
	if (argv.argc() > 1) 
	{
		int sec = strtol(argv[1], NULL, 10);
		sector_t *sector = &sectors[sec];
		TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;

		for (unsigned int i = 0; i < ffloors.Size(); i++)
		{
			double height=ffloors[i]->top.plane->ZatPoint(sector->centerspot);
			double bheight=ffloors[i]->bottom.plane->ZatPoint(sector->centerspot);

			IGNORE_FORMAT_PRE
			Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n", 
				i, height, ffloors[i]->top.model->sectornum, 
				bheight, ffloors[i]->bottom.model->sectornum,
				ffloors[i]->flags, ffloors[i]->alpha, (ffloors[i]->flags&FF_EXISTS)? "Exists":"", (ffloors[i]->flags&FF_DYNAMIC)? "Dynamic":"");
			IGNORE_FORMAT_POST
		}
	}
}